

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

ssize_t __thiscall
anon_unknown.dwarf_2584e2d::Impl::send(Impl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  ulong uVar2;
  void **__n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  void *event_local;
  TypeInfo *typeinfo_local;
  Serializer s;
  
  typeinfo_local = (TypeInfo *)CONCAT44(in_register_00000034,__fd);
  event_local = __buf;
  dap::json::JsonCppSerializer::JsonCppSerializer(&s);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(Impl **)local_58._M_unused._0_8_ = this;
  *(TypeInfo ***)((long)local_58._M_unused._0_8_ + 8) = &typeinfo_local;
  __n_00 = &event_local;
  *(void ***)((long)local_58._M_unused._0_8_ + 0x10) = __n_00;
  pcStack_40 = std::
               _Function_handler<bool_(dap::FieldSerializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/src/session.cpp:128:19)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(dap::FieldSerializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/src/session.cpp:128:19)>
             ::_M_manager;
  bVar1 = dap::json::JsonCppSerializer::object
                    (&s,(function<bool_(dap::FieldSerializer_*)> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  if (bVar1) {
    dap::json::JsonCppSerializer::dump_abi_cxx11_((string *)&local_58,&s);
    uVar2 = send(this,(int)&local_58,__buf_00,(size_t)__n_00,__flags);
    uVar2 = uVar2 & 0xffffffff;
    std::__cxx11::string::~string((string *)local_58._M_pod_data);
  }
  else {
    uVar2 = 0;
  }
  dap::json::JsonCppSerializer::~JsonCppSerializer(&s);
  return uVar2;
}

Assistant:

bool send(const dap::TypeInfo* typeinfo, const void* event) override {
    dap::json::Serializer s;
    if (!s.object([&](dap::FieldSerializer* fs) {
          return fs->field("seq", dap::integer(nextSeq++)) &&
                 fs->field("type", "event") &&
                 fs->field("event", typeinfo->name()) &&
                 fs->field("body", [&](dap::Serializer* s) {
                   return typeinfo->serialize(s, event);
                 });
        })) {
      return false;
    }
    return send(s.dump());
  }